

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmClassDefinition
                    (ExpressionContext *ctx,VmModule *module,ExprClassDefinition *node)

{
  VmValue *pVVar1;
  
  pVVar1 = anon_unknown.dwarf_11cad6::CreateVoid(module);
  pVVar1 = anon_unknown.dwarf_11cad6::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmClassDefinition(ExpressionContext &ctx, VmModule *module, ExprClassDefinition *node)
{
	return CheckType(ctx, node, CreateVoid(module));
}